

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

void sdf_contour_done(FT_Memory memory,SDF_Contour **contour)

{
  SDF_Edge *local_28;
  SDF_Edge *temp;
  SDF_Edge *edges;
  SDF_Contour **contour_local;
  FT_Memory memory_local;
  
  if (((memory != (FT_Memory)0x0) && (contour != (SDF_Contour **)0x0)) &&
     (*contour != (SDF_Contour *)0x0)) {
    temp = (*contour)->edges;
    edges = (SDF_Edge *)contour;
    contour_local = (SDF_Contour **)memory;
    while (temp != (SDF_Edge *)0x0) {
      local_28 = temp;
      temp = temp->next;
      sdf_edge_done((FT_Memory)contour_local,&local_28);
    }
    ft_mem_free((FT_Memory)contour_local,(void *)(edges->start_pos).x);
    (edges->start_pos).x = 0;
  }
  return;
}

Assistant:

static void
  sdf_contour_done( FT_Memory      memory,
                    SDF_Contour**  contour )
  {
    SDF_Edge*  edges;
    SDF_Edge*  temp;


    if ( !memory || !contour || !*contour )
      return;

    edges = (*contour)->edges;

    /* release all edges */
    while ( edges )
    {
      temp  = edges;
      edges = edges->next;

      sdf_edge_done( memory, &temp );
    }

    FT_FREE( *contour );
  }